

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::Test::HasFatalFailure(void)

{
  pointer pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  pointer pTVar8;
  TestResult *pTVar9;
  ulong uVar10;
  long unaff_RBX;
  bool bVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  
  UnitTest::GetInstance();
  pTVar9 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ != (TestInfo *)0x0) {
    pTVar9 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
  }
  pTVar8 = (pTVar9->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (pTVar9->test_part_results_).
           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar8 == pTVar1) {
    bVar11 = false;
  }
  else {
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx512f(_DAT_0013ff38);
    auVar16 = vpbroadcastd_avx512f(ZEXT416(2));
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    lVar7 = -0x70 - (long)pTVar8;
    auVar17 = vpbroadcastq_avx512f();
    uVar10 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar20);
      uVar10 = uVar10 + 0x10;
      auVar20 = vporq_avx512f(auVar18,auVar14);
      auVar18 = vporq_avx512f(auVar18,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar20,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar12 = CONCAT11(bVar6,bVar5);
      auVar20 = vpgatherdd_avx512f(*(undefined4 *)((long)&pTVar8->type_ + unaff_RBX));
      auVar18._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar20._4_4_;
      auVar18._0_4_ = (uint)(bVar5 & 1) * auVar20._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar20._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar20._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar20._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar20._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar20._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar20._28_4_;
      auVar18._32_4_ = (uint)(bVar6 & 1) * auVar20._32_4_;
      auVar18._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar20._36_4_;
      auVar18._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar20._40_4_;
      auVar18._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar20._44_4_;
      auVar18._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar20._48_4_;
      auVar18._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar20._52_4_;
      auVar18._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar20._56_4_;
      auVar18._60_4_ = (uint)(bVar6 >> 7) * auVar20._60_4_;
      pTVar8 = pTVar8 + 0x10;
      uVar4 = vpcmpeqd_avx512f(auVar18,auVar16);
      auVar20 = vpmovm2d_avx512dq(uVar4);
      auVar20 = vpsubd_avx512f(auVar19,auVar20);
    } while (((ulong)((long)pTVar1 + lVar7) / 0x70 + 0x10 & 0xfffffffffffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar20);
    auVar15._0_4_ = (uint)(bVar5 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar19._0_4_;
    bVar11 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar11 * auVar14._4_4_ | (uint)!bVar11 * auVar19._4_4_;
    bVar11 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar11 * auVar14._8_4_ | (uint)!bVar11 * auVar19._8_4_;
    bVar11 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar11 * auVar14._12_4_ | (uint)!bVar11 * auVar19._12_4_;
    bVar11 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar11 * auVar14._16_4_ | (uint)!bVar11 * auVar19._16_4_;
    bVar11 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar11 * auVar14._20_4_ | (uint)!bVar11 * auVar19._20_4_;
    bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar11 * auVar14._24_4_ | (uint)!bVar11 * auVar19._24_4_;
    bVar11 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar11 * auVar14._28_4_ | (uint)!bVar11 * auVar19._28_4_;
    auVar15._32_4_ = (uint)(bVar6 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._32_4_;
    bVar11 = (bool)(bVar6 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar11 * auVar14._36_4_ | (uint)!bVar11 * auVar19._36_4_;
    bVar11 = (bool)(bVar6 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar11 * auVar14._40_4_ | (uint)!bVar11 * auVar19._40_4_;
    bVar11 = (bool)(bVar6 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar11 * auVar14._44_4_ | (uint)!bVar11 * auVar19._44_4_;
    bVar11 = (bool)(bVar6 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar11 * auVar14._48_4_ | (uint)!bVar11 * auVar19._48_4_;
    bVar11 = (bool)(bVar6 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar11 * auVar14._52_4_ | (uint)!bVar11 * auVar19._52_4_;
    bVar11 = (bool)(bVar6 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar11 * auVar14._56_4_ | (uint)!bVar11 * auVar19._56_4_;
    auVar15._60_4_ =
         (uint)(bVar6 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar19._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpaddd_avx512f(auVar15,ZEXT3264(auVar13));
    auVar2 = vpaddd_avx(auVar14._0_16_,auVar14._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpaddd_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpaddd_avx(auVar2,auVar3);
    bVar11 = auVar2._0_4_ != 0;
  }
  return bVar11;
}

Assistant:

bool Test::HasFatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->HasFatalFailure();
}